

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O0

void cmsysMD5_Finalize(cmsysMD5 *md5,uchar *digest)

{
  uchar *digest_local;
  cmsysMD5 *md5_local;
  
  md5_finish(&md5->md5_state,digest);
  return;
}

Assistant:

void kwsysMD5_Finalize(kwsysMD5* md5, unsigned char digest[16])
{
  md5_finish(&md5->md5_state, (md5_byte_t*)digest);
}